

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

string * __thiscall fasttext::Dictionary::getWord_abi_cxx11_(Dictionary *this,int32_t id)

{
  const_reference pvVar1;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  
  if (in_EDX < 0) {
    __assert_fail("id >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Lizhen0909[P]LSHVec/src/dictionary.cc"
                  ,0x8a,"std::string fasttext::Dictionary::getWord(int32_t) const");
  }
  if (in_EDX < *(int *)(in_RSI + 0x58)) {
    pvVar1 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                       ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RSI + 0x28)
                        ,(long)in_EDX);
    std::__cxx11::string::string(in_RDI,(string *)pvVar1);
    return in_RDI;
  }
  __assert_fail("id < size_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Lizhen0909[P]LSHVec/src/dictionary.cc"
                ,0x8b,"std::string fasttext::Dictionary::getWord(int32_t) const");
}

Assistant:

std::string Dictionary::getWord(int32_t id) const {
  assert(id >= 0);
  assert(id < size_);
  return words_[id].word;
}